

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O0

mcpl_generic_filehandle_t * mcpl_generic_fopen_try(char *filename)

{
  int iVar1;
  char *__s1;
  gzFile pgVar2;
  FILE *pFVar3;
  char *in_RSI;
  mcpl_generic_filehandle_t *in_RDI;
  char *lastdot;
  char *in_stack_ffffffffffffffe8;
  
  in_RDI->mode = 0;
  in_RDI->current_pos = 0;
  in_RDI->internal = (void *)0x0;
  __s1 = strrchr(in_RSI,0x2e);
  if ((__s1 != (char *)0x0) && (iVar1 = strcmp(__s1,".gz"), iVar1 == 0)) {
    pgVar2 = mcpl_gzopen(filename,lastdot);
    in_RDI->internal = pgVar2;
    in_RDI->mode = 1;
    return in_RDI;
  }
  pFVar3 = mcpl_internal_fopen(__s1,in_stack_ffffffffffffffe8);
  in_RDI->internal = pFVar3;
  return in_RDI;
}

Assistant:

mcpl_generic_filehandle_t mcpl_generic_fopen_try( const char * filename )
{
  mcpl_generic_filehandle_t res;
  res.mode = 0;
  res.current_pos = 0;
  res.internal = NULL;

  const char * lastdot = strrchr(filename, '.');
  if (lastdot && strcmp(lastdot, ".gz") == 0) {
    MCPL_STATIC_ASSERT( sizeof(gzFile) == sizeof(void*) );
    res.internal = (void*)mcpl_gzopen( filename, "rb" );
    res.mode = 0x1;
  } else {
    res.internal = (void*)mcpl_internal_fopen(filename,"rb");
  }
  return res;
}